

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_scandir_empty_dir(void)

{
  int iVar1;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_dirent_t dent;
  uv_fs_t req;
  
  loop = (uv_loop_t *)uv_default_loop();
  uv_fs_mkdir(0,&req,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(&req);
  memset(&req,0xdb,0x1c0);
  iVar1 = uv_fs_scandir(0,&req,"./empty_dir/",0,0);
  dent.name = (char *)(long)iVar1;
  if (dent.name == (char *)0x0) {
    dent.name = (char *)req.result;
    if (req.result != 0) {
      pcVar3 = "req.result";
      uVar2 = 0xc79;
      goto LAB_00136aa7;
    }
    if (req.ptr != (void *)0x0) {
      eval_b_2 = 0;
      pcVar4 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar3 = "req.ptr";
      uVar2 = 0xc7a;
      goto LAB_00136c1f;
    }
    eval_b = -0xfff;
    iVar1 = uv_fs_scandir_next(&req,&dent);
    eval_b_2 = (int64_t)iVar1;
    if (eval_b_2 == -0xfff) {
      uv_fs_req_cleanup(&req);
      iVar1 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
      req.ptr = (void *)(long)iVar1;
      eval_b_2 = 0;
      if ((char *)req.ptr == (char *)0x0) {
        req.ptr = (void *)(long)scandir_cb_count;
        eval_b_2 = 0;
        if ((char *)req.ptr == (char *)0x0) {
          uv_run(loop,0);
          eval_b = 1;
          eval_b_2 = (int64_t)scandir_cb_count;
          if (eval_b_2 == 1) {
            uv_fs_rmdir(0,&req,"./empty_dir/",0);
            uv_fs_req_cleanup(&req);
            close_loop(loop);
            eval_b = 0;
            iVar1 = uv_loop_close(loop);
            eval_b_2 = (int64_t)iVar1;
            if (eval_b_2 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(loop)";
            pcVar3 = "0";
            uVar2 = 0xc88;
            req.ptr = (void *)eval_b;
          }
          else {
            pcVar4 = "scandir_cb_count";
            pcVar3 = "1";
            uVar2 = 0xc83;
            req.ptr = (void *)eval_b;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "scandir_cb_count";
          uVar2 = 0xc81;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0xc7f;
      }
    }
    else {
      pcVar4 = "uv_fs_scandir_next(&req, &dent)";
      pcVar3 = "UV_EOF";
      uVar2 = 0xc7b;
      req.ptr = (void *)eval_b;
    }
  }
  else {
    pcVar3 = "r";
    uVar2 = 0xc78;
LAB_00136aa7:
    pcVar4 = "0";
    eval_b_2 = 0;
    req.ptr = dent.name;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_00136c1f:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
          ,uVar2,pcVar3,"==",pcVar4,req.ptr,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  ASSERT_NULL(req.ptr);
  ASSERT_EQ(UV_EOF, uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT_OK(r);

  ASSERT_OK(scandir_cb_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, scandir_cb_count);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}